

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGrid.cpp
# Opt level: O2

void __thiscall PatternGrid::dragMoveEvent(PatternGrid *this,QDragMoveEvent *evt)

{
  QPoint pos;
  int iVar1;
  int iVar2;
  PatternCursor PVar3;
  QPointF local_18;
  
  local_18.xp = *(qreal *)(evt + 0x10);
  local_18.yp = *(qreal *)(evt + 0x18);
  pos = QPointF::toPoint(&local_18);
  PVar3 = mouseToCursor(this,pos);
  iVar1 = 0xb;
  if (PVar3.super_PatternCursorBase.column < 0xb) {
    iVar1 = PVar3.super_PatternCursorBase.column;
  }
  if (PVar3.super_PatternCursorBase._0_8_ < 0) {
    iVar1 = 0;
  }
  iVar2 = 3;
  if (PVar3.super_PatternCursorBase.track < 3) {
    iVar2 = PVar3.super_PatternCursorBase.track;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  if ((((this->mDragPos).super_PatternCursorBase.row != PVar3.super_PatternCursorBase.row) ||
      (iVar1 != (this->mDragPos).super_PatternCursorBase.column)) ||
     (iVar2 != (this->mDragPos).super_PatternCursorBase.track)) {
    (this->mDragPos).super_PatternCursorBase.row = PVar3.super_PatternCursorBase.row;
    (this->mDragPos).super_PatternCursorBase.column = iVar1;
    (this->mDragPos).super_PatternCursorBase.track = iVar2;
    QWidget::update();
  }
  return;
}

Assistant:

void PatternGrid::dragMoveEvent(QDragMoveEvent *evt) {

    auto pos = evt->position().toPoint();

    auto cursor = mouseToCursor(pos);
    cursor.column = std::clamp(cursor.column, 0, PatternCursor::MAX_COLUMNS - 1);
    cursor.track = std::clamp(cursor.track, 0, PatternCursor::MAX_TRACKS - 1);
    //cursor.column = PatternSelection::selectColumn(cursor.column);
    if (cursor != mDragPos) {
        mDragPos = cursor;
        
        update();
    }


}